

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O2

long __thiscall
cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::
fill_internal_output
          (cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
           *this,float *input_buffer,long *input_frames_count,float *output_buffer,
          long output_frames_needed)

{
  uint32_t uVar1;
  float *pfVar2;
  long lVar3;
  size_t sVar4;
  cubeb_resampler_speex_one_way<float> *this_00;
  ulong frame_count;
  
  this_00 = (this->output_processor)._M_t.
            super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
            .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
  if (this->draining == false) {
    uVar1 = cubeb_resampler_speex_one_way<float>::input_needed_for_output
                      (this_00,(int32_t)output_frames_needed);
    frame_count = (ulong)uVar1;
    pfVar2 = cubeb_resampler_speex_one_way<float>::input_buffer
                       ((this->output_processor)._M_t.
                        super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                        .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>.
                        _M_head_impl,frame_count);
    lVar3 = (*this->data_callback)(this->stream,this->user_ptr,(void *)0x0,pfVar2,frame_count);
    if ((lVar3 < (long)frame_count) && (this->draining = true, lVar3 < 0)) {
      return lVar3;
    }
    this_00 = (this->output_processor)._M_t.
              super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
              .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
    (this_00->resampling_in_buffer).length_ =
         lVar3 * (ulong)(this_00->super_processor).channels + (ulong)this_00->leftover_samples;
  }
  sVar4 = cubeb_resampler_speex_one_way<float>::output(this_00,output_buffer,output_frames_needed);
  return sVar4;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_output(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long output_frames_needed)
{
  assert(!input_buffer && (!input_frames_count || *input_frames_count == 0) &&
         output_buffer && output_frames_needed);

  if (!draining) {
    long got = 0;
    T * out_unprocessed = nullptr;
    long output_frames_before_processing = 0;

    /* fill directly the input buffer of the output processor to save a copy */
    output_frames_before_processing =
        output_processor->input_needed_for_output(output_frames_needed);

    out_unprocessed =
        output_processor->input_buffer(output_frames_before_processing);

    got = data_callback(stream, user_ptr, nullptr, out_unprocessed,
                        output_frames_before_processing);

    if (got < output_frames_before_processing) {
      draining = true;

      if (got < 0) {
        return got;
      }
    }

    output_processor->written(got);
  }

  /* Process the output. If not enough frames have been returned from the
   * callback, drain the processors. */
  return output_processor->output(output_buffer, output_frames_needed);
}